

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O2

void hexdumpdwords<unsigned_char*>(string *str,uchar *buf,size_t nLength,char sep)

{
  size_t sVar1;
  char *pcVar2;
  
  std::__cxx11::string::resize((ulong)str);
  pcVar2 = (str->_M_dataplus)._M_p + str->_M_string_length + nLength * -9;
  for (sVar1 = 0; nLength != sVar1; sVar1 = sVar1 + 1) {
    *pcVar2 = sep;
    dword2hexchars(*(uint32_t *)(buf + sVar1 * 4),pcVar2 + 1);
    pcVar2 = pcVar2 + 9;
  }
  return;
}

Assistant:

void hexdumpdwords(std::string &str, I buf, size_t nLength, char sep=' ')
{
    str.resize(str.size()+nLength*9);
    char *p= &str[str.size()-nLength*9];
    while(nLength--)
    {
        *p++ = sep;
        dword2hexchars(get32le(buf), p); p+=8; buf+=4;
    }
}